

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O2

void testing::internal::Log(LogSeverity severity,string *message,int stack_frames_to_skip)

{
  bool bVar1;
  ostream *poVar2;
  int skip_count;
  string local_40;
  
  bVar1 = LogIsVisible(severity);
  if (bVar1) {
    MutexBase::Lock((MutexBase *)g_log_mutex);
    if (severity == kWarning) {
      std::operator<<((ostream *)&std::cout,"\nGMOCK WARNING:");
    }
    if ((message->_M_string_length == 0) || (*(message->_M_dataplus)._M_p != '\n')) {
      std::operator<<((ostream *)&std::cout,"\n");
    }
    std::operator<<((ostream *)&std::cout,(string *)message);
    if (-1 < stack_frames_to_skip) {
      if ((message->_M_string_length != 0) &&
         ((message->_M_dataplus)._M_p[message->_M_string_length - 1] != '\n')) {
        std::operator<<((ostream *)&std::cout,"\n");
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Stack trace:\n");
      GetCurrentOsStackTraceExceptTop_abi_cxx11_
                (&local_40,(internal *)(ulong)(stack_frames_to_skip + 1),skip_count);
      std::operator<<(poVar2,(string *)&local_40);
      std::__cxx11::string::_M_dispose();
    }
    std::ostream::flush();
    MutexBase::Unlock((MutexBase *)g_log_mutex);
  }
  return;
}

Assistant:

GTEST_API_ void Log(LogSeverity severity, const std::string& message,
                    int stack_frames_to_skip) {
  if (!LogIsVisible(severity)) return;

  // Ensures that logs from different threads don't interleave.
  MutexLock l(&g_log_mutex);

  if (severity == kWarning) {
    // Prints a GMOCK WARNING marker to make the warnings easily searchable.
    std::cout << "\nGMOCK WARNING:";
  }
  // Pre-pends a new-line to message if it doesn't start with one.
  if (message.empty() || message[0] != '\n') {
    std::cout << "\n";
  }
  std::cout << message;
  if (stack_frames_to_skip >= 0) {
#ifdef NDEBUG
    // In opt mode, we have to be conservative and skip no stack frame.
    const int actual_to_skip = 0;
#else
    // In dbg mode, we can do what the caller tell us to do (plus one
    // for skipping this function's stack frame).
    const int actual_to_skip = stack_frames_to_skip + 1;
#endif  // NDEBUG

    // Appends a new-line to message if it doesn't end with one.
    if (!message.empty() && *message.rbegin() != '\n') {
      std::cout << "\n";
    }
    std::cout << "Stack trace:\n"
              << ::testing::internal::GetCurrentOsStackTraceExceptTop(
                     actual_to_skip);
  }
  std::cout << ::std::flush;
}